

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::rehashPowerOfTwo(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,size_t numBuckets)

{
  string *__ptr;
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  string *this_00;
  
  __ptr = (string *)this->mKeyVals;
  puVar1 = this->mInfo;
  uVar3 = this->mMask + 1;
  if (uVar3 < 0x28f5c28f5c28f5d) {
    uVar2 = (uVar3 * 0x50) / 100;
  }
  else {
    uVar2 = (uVar3 / 100) * 0x50;
  }
  uVar4 = 0xff;
  if (uVar2 < 0xff) {
    uVar4 = uVar2;
  }
  init_data(this,numBuckets);
  if (1 < uVar4 + uVar3) {
    this_00 = __ptr;
    for (uVar2 = 0; uVar4 + uVar3 != uVar2; uVar2 = uVar2 + 1) {
      if (puVar1[uVar2] != '\0') {
        insert_move(this,(Node *)this_00);
        std::__cxx11::string::~string(this_00);
      }
      this_00 = this_00 + 0x38;
    }
    if (__ptr != (string *)&this->mMask) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void rehashPowerOfTwo(size_t numBuckets) {
        ROBIN_HOOD_TRACE(this)

        Node* const oldKeyVals = mKeyVals;
        uint8_t const* const oldInfo = mInfo;

        const size_t oldMaxElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        // resize operation: move stuff
        init_data(numBuckets);
        if (oldMaxElementsWithBuffer > 1) {
            for (size_t i = 0; i < oldMaxElementsWithBuffer; ++i) {
                if (oldInfo[i] != 0) {
                    insert_move(std::move(oldKeyVals[i]));
                    // destroy the node but DON'T destroy the data.
                    oldKeyVals[i].~Node();
                }
            }

            // this check is not necessary as it's guarded by the previous if, but it helps silence
            // g++'s overeager "attempt to free a non-heap object 'map'
            // [-Werror=free-nonheap-object]" warning.
            if (oldKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
                // don't destroy old data: put it into the pool instead
                DataPool::addOrFree(oldKeyVals, calcNumBytesTotal(oldMaxElementsWithBuffer));
            }
        }
    }